

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
gdscpp::findRootSTR(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   gdscpp *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  int iVar2;
  ostream *poVar3;
  pointer pgVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  pointer pgVar8;
  ulong uVar9;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Finding the root structures.");
  std::endl<char,std::char_traits<char>>(poVar3);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  local_38 = __return_storage_ptr__;
  do {
    pgVar8 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pgVar4 - (long)pgVar8) / 0xf8) <= (ulong)local_3c) {
      std::operator<<((ostream *)&std::cout,"Root GDS structures: ");
      pvVar1 = local_38;
      for (puVar5 = (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 != (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"  ");
        std::operator<<(poVar3,(string *)
                               ((this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                                _M_impl.super__Vector_impl_data._M_start + *puVar5));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return pvVar1;
    }
    for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < (ulong)(((long)pgVar4 - (long)pgVar8) / 0xf8);
        uVar6 = uVar6 + 1) {
      uVar9 = 0;
      while (pgVar8 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_start,
            uVar9 < (ulong)(((long)*(pointer *)
                                    ((long)&pgVar8[uVar7].SREF.
                                            super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
                                            _M_impl + 8) -
                            *(long *)&pgVar8[uVar7].SREF.
                                      super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl)
                           / 0x78)) {
        iVar2 = std::__cxx11::string::compare((string *)(pgVar8 + local_3c));
        uVar9 = (ulong)((int)uVar9 + 1);
        if (iVar2 == 0) goto LAB_001082ba;
      }
      pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_38,&local_3c);
LAB_001082ba:
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

vector<unsigned int> gdscpp::findRootSTR()
{
  cout << "Finding the root structures." << endl;

  vector<unsigned int> rootSTRindexes;
  bool vecFound;

  for (unsigned int i = 0; i < this->STR.size(); i++) {
    vecFound = false;
    for (unsigned int j = 0; j < this->STR.size(); j++) {
      for (unsigned int k = 0; k < this->STR[j].SREF.size(); k++) {
        if (!this->STR[i].name.compare(this->STR[j].SREF[k].name)) {
          vecFound = true;
          break;
        }
      }
      if (vecFound) {
        break;
      }
    }
    if (vecFound == false) {
      rootSTRindexes.push_back(i);
    }
  }

  // display the root GDS STR
  cout << "Root GDS structures: ";

  vector<unsigned int>::iterator fooVec;
  for (fooVec = rootSTRindexes.begin(); fooVec != rootSTRindexes.end();
       fooVec++) {
    cout << "  " << this->STR[*fooVec].name;
  }
  cout << endl;

  return rootSTRindexes;
}